

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void WriteChipROM(CHIP_DEVICE *cDev,UINT8 memID,UINT32 memSize,UINT32 dataOfs,UINT32 dataLen,
                 UINT8 *data)

{
  UINT8 *data_local;
  UINT32 dataLen_local;
  UINT32 dataOfs_local;
  UINT32 memSize_local;
  UINT8 memID_local;
  CHIP_DEVICE *cDev_local;
  
  if (memID == '\0') {
    if (cDev->romSize != (DEVFUNC_WRITE_MEMSIZE)0x0) {
      (*cDev->romSize)((cDev->base).defInf.dataPtr,memSize);
    }
    if ((cDev->romWrite != (DEVFUNC_WRITE_BLOCK)0x0) && (dataLen != 0)) {
      (*cDev->romWrite)((cDev->base).defInf.dataPtr,dataOfs,dataLen,data);
    }
  }
  else {
    if (cDev->romSizeB != (DEVFUNC_WRITE_MEMSIZE)0x0) {
      (*cDev->romSizeB)((cDev->base).defInf.dataPtr,memSize);
    }
    if ((cDev->romWriteB != (DEVFUNC_WRITE_BLOCK)0x0) && (dataLen != 0)) {
      (*cDev->romWriteB)((cDev->base).defInf.dataPtr,dataOfs,dataLen,data);
    }
  }
  return;
}

Assistant:

static void WriteChipROM(VGMPlayer::CHIP_DEVICE* cDev, UINT8 memID,
						 UINT32 memSize, UINT32 dataOfs, UINT32 dataLen, const UINT8* data)
{
	if (memID == 0)
	{
		if (cDev->romSize != NULL)
			cDev->romSize(cDev->base.defInf.dataPtr, memSize);
		if (cDev->romWrite != NULL && dataLen)
			cDev->romWrite(cDev->base.defInf.dataPtr, dataOfs, dataLen, data);
	}
	else
	{
		if (cDev->romSizeB != NULL)
			cDev->romSizeB(cDev->base.defInf.dataPtr, memSize);
		if (cDev->romWriteB != NULL && dataLen)
			cDev->romWriteB(cDev->base.defInf.dataPtr, dataOfs, dataLen, data);
	}
	
	return;
}